

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::custom_layer_to_index(Net *this,char *type)

{
  int iVar1;
  ulong uVar2;
  pointer plVar3;
  ulong uVar4;
  ulong uVar5;
  
  plVar3 = (this->custom_layer_registry).
           super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->custom_layer_registry).
                        super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)plVar3) >> 4;
  uVar2 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar2;
  }
  while( true ) {
    if (uVar5 == uVar2) {
      return -1;
    }
    iVar1 = strcmp(type,plVar3->name);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
    plVar3 = plVar3 + 1;
  }
  return (int)uVar2;
}

Assistant:

int Net::custom_layer_to_index(const char* type)
{
    const int custom_layer_registry_entry_count = custom_layer_registry.size();
    for (int i=0; i<custom_layer_registry_entry_count; i++)
    {
        if (strcmp(type, custom_layer_registry[i].name) == 0)
            return i;
    }

    return -1;
}